

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxjenkins.c
# Opt level: O2

int nlalsm(double *vec,int N,int p,int delta,int q,double *phi,double *theta,int M,double *thetac,
          double *var,double eps,double *varcovar,double *residuals)

{
  size_t __size;
  double dVar1;
  uint uVar2;
  int tval;
  uint N_00;
  double *oup;
  void *__ptr;
  double *w;
  long lVar3;
  double *phi_00;
  double *theta_00;
  double *phi_01;
  double *theta_01;
  ulong uVar4;
  long lVar5;
  double *__ptr_00;
  double *a;
  double *a_00;
  double *a_01;
  void *__ptr_01;
  void *__ptr_02;
  double *A;
  void *__ptr_03;
  double *b;
  double *array;
  double *x;
  double *__ptr_04;
  int *ipiv;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double *pdVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  void *pvVar16;
  void *pvVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  int N_01;
  long lVar21;
  ulong uVar22;
  size_t sVar23;
  ulong uVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double local_180;
  double local_178;
  double local_c0;
  
  uVar10 = (ulong)(uint)N;
  if (eps < 0.0) {
    dVar25 = sqrt(eps);
  }
  else {
    dVar25 = SQRT(eps);
  }
  uVar2 = p * 0x14 + q;
  uVar11 = 0xf;
  if (0xf < (int)uVar2) {
    uVar11 = (ulong)uVar2;
  }
  sVar23 = (long)(N - delta) << 3;
  oup = (double *)malloc(sVar23);
  __ptr = malloc(sVar23);
  w = (double *)malloc(sVar23);
  lVar3 = (long)p;
  phi_00 = (double *)malloc(lVar3 * 8);
  theta_00 = (double *)malloc((long)q << 3);
  phi_01 = (double *)malloc(lVar3 * 8);
  theta_01 = (double *)malloc((long)q << 3);
  if (delta < 1) {
    uVar4 = 0;
    uVar12 = 0;
    if (0 < N) {
      uVar12 = uVar10;
    }
    for (; uVar12 != uVar4; uVar4 = uVar4 + 1) {
      dVar26 = vec[uVar4];
      oup[uVar4] = dVar26;
      *(double *)((long)__ptr + uVar4 * 8) = dVar26;
    }
  }
  else {
    uVar2 = diff(vec,N,delta,oup);
    uVar10 = (ulong)uVar2;
    uVar4 = 0;
    uVar12 = uVar10;
    if ((int)uVar2 < 1) {
      uVar12 = 0;
    }
    for (; uVar12 != uVar4; uVar4 = uVar4 + 1) {
      *(double *)((long)__ptr + uVar4 * 8) = oup[uVar4];
    }
  }
  uVar20 = q + p;
  N_01 = (int)uVar10;
  USPE(oup,N_01,p,q,phi,theta,thetac,var);
  lVar13 = 0;
  uVar2 = uVar20;
  if (M == 1) {
    uVar4 = 0;
    uVar12 = 0;
    if (0 < N_01) {
      uVar12 = uVar10;
    }
    for (; uVar12 != uVar4; uVar4 = uVar4 + 1) {
      oup[uVar4] = oup[uVar4] - *thetac;
    }
    uVar2 = uVar20 + 1;
    lVar13 = 1;
  }
  uVar12 = (ulong)uVar2;
  lVar5 = (long)(int)uVar2;
  sVar23 = lVar5 * 8;
  __ptr_00 = (double *)malloc(sVar23);
  tval = (int)uVar11;
  N_00 = (tval + N_01) - 1;
  lVar21 = (long)(int)N_00;
  __size = lVar21 * 8;
  a = (double *)malloc(__size);
  a_00 = (double *)malloc(__size);
  a_01 = (double *)malloc(__size);
  __ptr_01 = malloc(__size);
  __ptr_02 = malloc(sVar23 * lVar21);
  A = (double *)malloc(sVar23 * lVar5);
  __ptr_03 = malloc(sVar23 * lVar5);
  b = (double *)malloc(sVar23);
  array = (double *)malloc(sVar23);
  x = (double *)malloc(sVar23);
  __ptr_04 = (double *)malloc(sVar23);
  ipiv = (int *)malloc(lVar5 * 4);
  if (M == 1) {
    *__ptr_00 = *thetac;
  }
  uVar6 = 0;
  uVar4 = 0;
  if (0 < p) {
    uVar4 = (ulong)(uint)p;
  }
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    __ptr_00[lVar13 + uVar6] = phi[uVar6];
  }
  uVar7 = 0;
  uVar6 = 0;
  if (0 < q) {
    uVar6 = (ulong)(uint)q;
  }
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    __ptr_00[(long)(p + (int)lVar13) + uVar7] = theta[uVar7];
  }
  avaluem(oup,N_01,p,q,phi,theta,tval,a);
  uVar7 = 0;
  uVar22 = 0;
  if (0 < (int)N_00) {
    uVar22 = (ulong)N_00;
  }
  for (; uVar22 != uVar7; uVar7 = uVar7 + 1) {
    *(double *)((long)__ptr_01 + uVar7 * 8) = a[uVar7];
  }
  uVar24 = 0;
  uVar7 = 0;
  if (0 < N_01) {
    uVar7 = uVar10;
  }
  uVar10 = 0;
  if (0 < (int)uVar2) {
    uVar10 = uVar12;
  }
  lVar14 = (long)(p + 1);
  pvVar16 = __ptr_02;
  for (; uVar24 != uVar10; uVar24 = uVar24 + 1) {
    dVar26 = __ptr_00[uVar24];
    dVar27 = dVar25 * dVar26 + dVar26;
    __ptr_00[uVar24] = dVar27;
    uVar8 = 0;
    if (M == 1) {
      for (; uVar4 != uVar8; uVar8 = uVar8 + 1) {
        phi_00[uVar8] = __ptr_00[uVar8 + 1];
      }
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        theta_00[uVar8] = __ptr_00[lVar14 + uVar8];
      }
      for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        w[uVar8] = *(double *)((long)__ptr + uVar8 * 8) - *__ptr_00;
      }
    }
    else {
      for (; uVar4 != uVar8; uVar8 = uVar8 + 1) {
        phi_00[uVar8] = __ptr_00[uVar8];
      }
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        theta_00[uVar8] = __ptr_00[lVar3 + uVar8];
      }
      for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        w[uVar8] = oup[uVar8];
      }
    }
    avaluem(w,N_01,p,q,phi_00,theta_00,tval,a_00);
    for (uVar8 = 0; uVar22 != uVar8; uVar8 = uVar8 + 1) {
      *(double *)((long)pvVar16 + uVar8 * 8) = (a[uVar8] - a_00[uVar8]) / (dVar27 - dVar26);
    }
    __ptr_00[uVar24] = dVar27 - (dVar27 - dVar26);
    pvVar16 = (void *)((long)pvVar16 + __size);
  }
  pvVar16 = __ptr_02;
  for (uVar24 = 0; uVar24 != uVar10; uVar24 = uVar24 + 1) {
    pvVar17 = __ptr_02;
    for (uVar8 = 0; uVar8 != uVar12; uVar8 = uVar8 + 1) {
      A[uVar24 * lVar5 + uVar8] = 0.0;
      dVar26 = 0.0;
      for (uVar18 = 0; uVar22 != uVar18; uVar18 = uVar18 + 1) {
        dVar26 = dVar26 + *(double *)((long)pvVar16 + uVar18 * 8) *
                          *(double *)((long)pvVar17 + uVar18 * 8);
        A[uVar24 * lVar5 + uVar8] = dVar26;
      }
      pvVar17 = (void *)((long)pvVar17 + __size);
    }
    pvVar16 = (void *)((long)pvVar16 + __size);
  }
  pvVar16 = __ptr_02;
  for (uVar24 = 0; uVar24 != uVar10; uVar24 = uVar24 + 1) {
    b[uVar24] = 0.0;
    dVar26 = 0.0;
    for (uVar8 = 0; uVar22 != uVar8; uVar8 = uVar8 + 1) {
      dVar26 = dVar26 + *(double *)((long)pvVar16 + uVar8 * 8) * a[uVar8];
      b[uVar24] = dVar26;
    }
    dVar26 = A[(int)((uVar2 + 1) * (int)uVar24)];
    if (dVar26 < 0.0) {
      dVar26 = sqrt(dVar26);
    }
    else {
      dVar26 = SQRT(dVar26);
    }
    array[uVar24] = dVar26;
    pvVar16 = (void *)((long)pvVar16 + __size);
  }
  array_max(array,uVar2);
  uVar24 = (ulong)(uVar2 * uVar2);
  uVar15 = 0;
  local_c0 = 0.01;
  dVar26 = 2.0;
  local_180 = 1.0;
  while ((1e-08 <= local_180 && (uVar15 < 200))) {
    pdVar9 = A;
    for (uVar8 = 0; uVar8 != uVar10; uVar8 = uVar8 + 1) {
      for (uVar18 = 0; uVar12 != uVar18; uVar18 = uVar18 + 1) {
        if (uVar15 == 0) {
          pdVar9[uVar18] = pdVar9[uVar18] / (array[uVar8] * array[uVar18]);
        }
        if (uVar8 == uVar18) {
          A[uVar8 + uVar8 * lVar5] = local_c0 + 1.0;
        }
      }
      pdVar9 = pdVar9 + lVar5;
    }
    if (uVar15 == 0) {
      for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
        b[uVar8] = b[uVar8] / array[uVar8];
      }
    }
    uVar15 = uVar15 + 1;
    for (uVar8 = 0; uVar24 != uVar8; uVar8 = uVar8 + 1) {
      *(double *)((long)__ptr_03 + uVar8 * 8) = A[uVar8];
    }
    ludecomp(A,uVar2,ipiv);
    linsolve(A,uVar2,b,ipiv,x);
    for (uVar8 = 0; uVar24 != uVar8; uVar8 = uVar8 + 1) {
      A[uVar8] = *(double *)((long)__ptr_03 + uVar8 * 8);
    }
    for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
      dVar27 = x[uVar8];
      dVar1 = array[uVar8];
      x[uVar8] = dVar27 / dVar1;
      __ptr_04[uVar8] = dVar27 / dVar1 + __ptr_00[uVar8];
    }
    uVar8 = 0;
    if (M == 1) {
      for (; uVar4 != uVar8; uVar8 = uVar8 + 1) {
        phi_01[uVar8] = __ptr_04[uVar8 + 1];
      }
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        theta_01[uVar8] = __ptr_04[lVar14 + uVar8];
      }
      for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        w[uVar8] = *(double *)((long)__ptr + uVar8 * 8) - *__ptr_04;
      }
    }
    else {
      for (; uVar4 != uVar8; uVar8 = uVar8 + 1) {
        phi_01[uVar8] = __ptr_04[uVar8];
      }
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        theta_01[uVar8] = __ptr_04[lVar3 + uVar8];
      }
      for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        w[uVar8] = oup[uVar8];
      }
    }
    avaluem(w,N_01,p,q,phi_01,theta_01,tval,a_01);
    for (uVar8 = 0; uVar22 != uVar8; uVar8 = uVar8 + 1) {
      *(double *)((long)__ptr_01 + uVar8 * 8) = a_01[uVar8];
    }
    dVar27 = sosqm(a_01,N_00);
    local_178 = sosqm(a,N_00);
    local_180 = array_max_abs(x,uVar2);
    if (dVar27 < local_178) {
      if (local_180 < 1e-08) break;
      for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
        __ptr_00[uVar8] = __ptr_04[uVar8];
      }
      uVar8 = 0;
      if (M == 1) {
        for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
          w[uVar8] = *(double *)((long)__ptr + uVar8 * 8) - *__ptr_00;
        }
      }
      else {
        for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
          w[uVar8] = oup[uVar8];
        }
      }
      local_c0 = local_c0 / dVar26;
      avaluem(w,N_01,p,q,phi_01,theta_01,tval,a);
      for (uVar8 = 0; uVar22 != uVar8; uVar8 = uVar8 + 1) {
        *(double *)((long)__ptr_01 + uVar8 * 8) = a[uVar8];
      }
      pvVar16 = __ptr_02;
      for (uVar8 = 0; uVar8 != uVar10; uVar8 = uVar8 + 1) {
        dVar26 = __ptr_00[uVar8];
        dVar27 = dVar25 * dVar26 + dVar26;
        __ptr_00[uVar8] = dVar27;
        uVar18 = 0;
        if (M == 1) {
          for (; uVar4 != uVar18; uVar18 = uVar18 + 1) {
            phi_00[uVar18] = __ptr_00[uVar18 + 1];
          }
          for (uVar18 = 0; uVar6 != uVar18; uVar18 = uVar18 + 1) {
            theta_00[uVar18] = __ptr_00[lVar14 + uVar18];
          }
          for (uVar18 = 0; uVar7 != uVar18; uVar18 = uVar18 + 1) {
            w[uVar18] = *(double *)((long)__ptr + uVar18 * 8) - *__ptr_00;
          }
        }
        else {
          for (; uVar4 != uVar18; uVar18 = uVar18 + 1) {
            phi_00[uVar18] = __ptr_00[uVar18];
          }
          for (uVar18 = 0; uVar6 != uVar18; uVar18 = uVar18 + 1) {
            theta_00[uVar18] = __ptr_00[lVar3 + uVar18];
          }
          for (uVar18 = 0; uVar7 != uVar18; uVar18 = uVar18 + 1) {
            w[uVar18] = oup[uVar18];
          }
        }
        avaluem(w,N_01,p,q,phi_00,theta_00,tval,a_00);
        for (uVar18 = 0; uVar22 != uVar18; uVar18 = uVar18 + 1) {
          *(double *)((long)pvVar16 + uVar18 * 8) = (a[uVar18] - a_00[uVar18]) / (dVar27 - dVar26);
        }
        __ptr_00[uVar8] = dVar27 - (dVar27 - dVar26);
        pvVar16 = (void *)((long)pvVar16 + __size);
      }
      pvVar16 = __ptr_02;
      for (uVar8 = 0; uVar8 != uVar10; uVar8 = uVar8 + 1) {
        pvVar17 = __ptr_02;
        for (uVar18 = 0; uVar18 != uVar12; uVar18 = uVar18 + 1) {
          A[uVar8 * lVar5 + uVar18] = 0.0;
          dVar26 = 0.0;
          for (uVar19 = 0; uVar22 != uVar19; uVar19 = uVar19 + 1) {
            dVar26 = dVar26 + *(double *)((long)pvVar16 + uVar19 * 8) *
                              *(double *)((long)pvVar17 + uVar19 * 8);
            A[uVar8 * lVar5 + uVar18] = dVar26;
          }
          pvVar17 = (void *)((long)pvVar17 + __size);
        }
        pvVar16 = (void *)((long)pvVar16 + __size);
      }
      pvVar16 = __ptr_02;
      for (uVar8 = 0; uVar8 != uVar10; uVar8 = uVar8 + 1) {
        b[uVar8] = 0.0;
        dVar26 = 0.0;
        for (uVar18 = 0; uVar22 != uVar18; uVar18 = uVar18 + 1) {
          dVar26 = dVar26 + *(double *)((long)pvVar16 + uVar18 * 8) * a[uVar18];
          b[uVar8] = dVar26;
        }
        dVar26 = A[(int)((uVar2 + 1) * (int)uVar8)];
        if (dVar26 < 0.0) {
          dVar26 = sqrt(dVar26);
        }
        else {
          dVar26 = SQRT(dVar26);
        }
        array[uVar8] = dVar26;
        pvVar16 = (void *)((long)pvVar16 + __size);
      }
      pdVar9 = A;
      for (uVar8 = 0; uVar8 != uVar10; uVar8 = uVar8 + 1) {
        for (uVar18 = 0; uVar12 != uVar18; uVar18 = uVar18 + 1) {
          dVar26 = local_c0 + 1.0;
          if (uVar8 != uVar18) {
            dVar26 = pdVar9[uVar18] / (array[uVar8] * array[uVar18]);
          }
          pdVar9[uVar18] = dVar26;
        }
        pdVar9 = pdVar9 + lVar5;
      }
      for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
        b[uVar8] = b[uVar8] / array[uVar8];
      }
      dVar26 = 2.0;
    }
    else {
      local_c0 = local_c0 * dVar26;
      dVar26 = dVar26 + dVar26;
    }
  }
  *var = local_178 / (double)(int)(N_01 - (uVar20 + (int)lVar13));
  dVar25 = 0.0;
  if (M == 1) {
    dVar25 = 0.0;
    for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      dVar25 = dVar25 + phi_01[uVar7];
    }
    dVar25 = (1.0 - dVar25) * *__ptr_00;
  }
  *thetac = dVar25;
  for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
    phi[uVar7] = phi_01[uVar7];
  }
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    theta[uVar4] = theta_01[uVar4];
  }
  pvVar16 = __ptr_02;
  for (uVar4 = 0; uVar4 != uVar10; uVar4 = uVar4 + 1) {
    pvVar17 = __ptr_02;
    for (uVar6 = 0; uVar6 != uVar12; uVar6 = uVar6 + 1) {
      A[uVar4 * lVar5 + uVar6] = 0.0;
      dVar25 = 0.0;
      for (uVar7 = 0; uVar22 != uVar7; uVar7 = uVar7 + 1) {
        dVar25 = dVar25 + *(double *)((long)pvVar16 + uVar7 * 8) *
                          *(double *)((long)pvVar17 + uVar7 * 8);
        A[uVar4 * lVar5 + uVar6] = dVar25;
      }
      pvVar17 = (void *)((long)pvVar17 + __size);
    }
    pvVar16 = (void *)((long)pvVar16 + __size);
  }
  ludecomp(A,uVar2,ipiv);
  minverse(A,uVar2,ipiv,varcovar);
  for (uVar10 = 0; uVar24 != uVar10; uVar10 = uVar10 + 1) {
    varcovar[uVar10] = varcovar[uVar10] * *var;
  }
  for (lVar3 = uVar11 - 1; lVar3 < lVar21; lVar3 = lVar3 + 1) {
    *residuals = *(double *)((long)__ptr_01 + lVar3 * 8);
    residuals = residuals + 1;
  }
  free(oup);
  free(w);
  free(phi_00);
  free(theta_00);
  free(__ptr_00);
  free(a);
  free(a_00);
  free(__ptr_02);
  free(A);
  free(b);
  free(array);
  free(x);
  free(__ptr_04);
  free(ipiv);
  free(phi_01);
  free(theta_01);
  free(a_01);
  free(__ptr_01);
  free(__ptr);
  free(__ptr_03);
  return (uint)(199 < (int)uVar15) * 3 + 1;
}

Assistant:

int nlalsm(double *vec,int N,int p,int delta, int q, double *phi,double *theta,
		int M,double *thetac,double *var,double eps,double *varcovar,double *residuals) {
	int retval,i,j,l,k,t,t2,it,Norig,qd,itmax;
	double lam,vmul,e1,di,eps2,stepsize,temp,tau,hmax,suminc,sumb;
	double *inp,*b,*at,*at0,*x,*phi0,*theta0,*orig,*A,*g,*D,*h,*binc,*Atemp;
	double *phiinc,*thetainc,*atinc,*resat,*origval;
	int *ipiv;


	eps2 = sqrt(eps);
	lam = 0.01;
	vmul = 2.0;
	e1 = 1.0e-08;
	it = 0;
	Norig = N;
	k = p + q;
	di = eps2;//0.001;//eps2;//0.001
	qd = q + 20 * p;

	if (qd < 15) {
		qd = 15;
	}
	hmax = 1;
	itmax = 200;

	inp = (double*) malloc(sizeof(double) * (N - delta));
	origval = (double*) malloc(sizeof(double) * (N - delta));
	orig = (double*) malloc(sizeof(double) * (N - delta));
	phi0 = (double*) malloc(sizeof(double) * p);
	theta0 = (double*) malloc(sizeof(double) * q);
	phiinc = (double*) malloc(sizeof(double) * p);
	thetainc = (double*) malloc(sizeof(double) * q);
	
	if (delta > 0) {
		N = diff(vec,Norig,delta,inp);
		for (i = 0; i < N;++i) {
			origval[i] = inp[i];
		}
	} else {
		for(i = 0; i < N;++i) {
			inp[i] = vec[i];
			origval[i] = inp[i];
		}
	}
	

	USPE(inp,N,p,q,phi,theta,thetac,var); // Initial Parameters

	if (M == 1) {
		for(i = 0; i < N;++i) {
			inp[i] -= *thetac;
		}
		M = 1;
		k++;
	} else {
		M = 0;
	}
	
	b = (double*) malloc(sizeof(double) * k);
	at = (double*) malloc(sizeof(double) * (N+qd-1));
	at0 = (double*) malloc(sizeof(double) * (N+qd-1));
	atinc = (double*) malloc(sizeof(double) * (N+qd-1));
	resat = (double*) malloc(sizeof(double) * (N+qd-1));
	x = (double*) malloc(sizeof(double) * k * (N+qd-1));
	A = (double*) malloc(sizeof(double) * k * k);
	Atemp = (double*) malloc(sizeof(double) * k * k);
	g = (double*) malloc(sizeof(double) * k);
	D = (double*) malloc(sizeof(double) * k);
	h = (double*) malloc(sizeof(double) * k);
	binc = (double*) malloc(sizeof(double) * k);
	ipiv = (int*) malloc(sizeof(int) * k);
	
	if (M == 1) {
		b[0] = *thetac;
	}
	
	for(i = 0; i < p;++i) {
		b[M+i] = phi[i];
	}
	
	for(i = 0; i < q;++i) {
		b[M+p+i] = theta[i];
	}
	
	//mdisplay(b,1,k);

    avaluem(inp,N,p,q,phi,theta,qd,at);
	
	for(i = 0; i < N+qd-1;++i) {
		resat[i] = at[i];
	}
	//mdisplay(at,1,N+qd-1);
	for(i = 0; i < k;++i) {
		stepsize = b[i]*di;//di;//b[i] * di;
		temp = b[i];
		b[i] += stepsize;
		stepsize = b[i] - temp;
		if (M == 1) {
			for(j = 0;j < p;++j) {
				phi0[j] = b[1+j];
			}
			for(j = 0; j < q;++j) {
				theta0[j] = b[p+1+j];
			}
			for(j = 0; j < N;++j) {
				orig[j] = origval[j] - b[0];
			}
		} else {
			for(j = 0;j < p;++j) {
				phi0[j] = b[j];
			}
			for(j = 0; j < q;++j) {
				theta0[j] = b[p+j];
			}
			for(j = 0; j < N;++j) {
				orig[j] = inp[j];
			}
		}
	    avaluem(orig,N,p,q,phi0,theta0,qd,at0);	
	    //mdisplay(inp,1,N);

		t = i * (N + qd - 1);
		
		for(j = 0; j < N + qd - 1;++j) {
			x[t+j] = (at[j] - at0[j]) / stepsize;
		}
		
		b[i] -= stepsize;
	}

	for(i = 0; i < k;++i) {
		t = i * (N + qd - 1);
		for(j = 0; j < k;++j) {
			t2 = j * (N + qd - 1);
			A[i*k+j] = 0.0;
			for(l = 0; l < N + qd -1;++l) {
				A[i*k+j] += x[t+l] * x[t2+l];
			}

		}
	}

	for(i = 0; i < k;++i) {
		t = i * (N + qd - 1);
		g[i] = 0.0;
		for(l = 0; l < N + qd - 1;++l) {
			g[i] += x[t+l] * at[l];
		}
		D[i] = sqrt(A[i*k+i]);
	}

	tau = array_max(D,k);
	//printf("TAU %g \n",tau);
	//mdisplay(x,k,N+qd-1);

	while (hmax >= e1 && it < itmax) {
		it++;
		for(i = 0; i < k;++i) {
			for(j = 0; j < k;++j) {
				if (it == 1) {
					A[i*k+j] = A[i*k+j] / (D[i] * D[j]);
				}
				if (i == j) {
					A[i*k+j] = 1.0 + lam;
				}
			}
		}

		if (it == 1) {
			for(i = 0; i < k; ++i) {
				g[i] = g[i] / D[i];
			}
		}

		for(i = 0; i < k*k;++i) {
			Atemp[i] = A[i];
		}
		ludecomp(A,k,ipiv);
		linsolve(A,k,g,ipiv,h);
		for(i = 0; i < k*k;++i) {
			A[i] = Atemp[i];
		}

		for(j = 0; j < k;++j) {
			h[j] = h[j] / D[j];
			binc[j] = b[j] + h[j];
		}

		if (M == 1) {
			for(j = 0;j < p;++j) {
				phiinc[j] = binc[1+j];
			}
			for(j = 0; j < q;++j) {
				thetainc[j] = binc[p+1+j];
			}

			for(j = 0; j < N;++j) {
				orig[j] = origval[j] - binc[0];
			}
		} else {
			for(j = 0;j < p;++j) {
				phiinc[j] = binc[j];
			}
			for(j = 0; j < q;++j) {
				thetainc[j] = binc[p+j];
			}
			for(j = 0; j < N;++j) {
				orig[j] = inp[j];
			}
		}

	    avaluem(orig,N,p,q,phiinc,thetainc,qd,atinc);
	    for(i = 0; i < N+qd-1;++i) {
	    	resat[i] = atinc[i];
	    }

	    suminc = sosqm(atinc,N+qd-1);
	    sumb = sosqm(at,N+qd-1);

	    hmax = array_max_abs(h,k);
	    //printf("HMAX %g %g %g \n",hmax,suminc,sumb);

	    if (suminc < sumb) {
	    	if (hmax < e1) {
	    		retval = 1;
	    		break;
	    	} else {
	    		for(i = 0; i < k;++i) {
	    			b[i] = binc[i];
	    		}
	    		lam = lam / vmul;
	    		vmul = 2.0;
				if (M == 1) {
					for(j = 0; j < N;++j) {
						orig[j] = origval[j] - b[0];
					}
				} else {
					for(j = 0; j < N;++j) {
						orig[j] = inp[j];
					}				
				}
			    avaluem(orig,N,p,q,phiinc,thetainc,qd,at);
			    for(i = 0; i < N+qd-1;++i) {
			    	resat[i] = at[i];
			    }
				
				for(i = 0; i < k;++i) {
					stepsize = b[i]*di;//di;//b[i] * di;
					temp = b[i];
					b[i] += stepsize;
					stepsize = b[i] - temp;
		
					if (M == 1) {
						for(j = 0;j < p;++j) {
							phi0[j] = b[1+j];
						}
						for(j = 0; j < q;++j) {
							theta0[j] = b[p+1+j];
						}

						for(j = 0; j < N;++j) {
							orig[j] = origval[j] - b[0];
						}

					} else {
						for(j = 0;j < p;++j) {
							phi0[j] = b[j];
						}
						for(j = 0; j < q;++j) {
							theta0[j] = b[p+j];
						}
						for(j = 0; j < N;++j) {
							orig[j] = inp[j];
						}
					}
				    avaluem(orig,N,p,q,phi0,theta0,qd,at0);	
					t = i * (N + qd - 1);
		
					for(j = 0; j < N + qd - 1;++j) {
						x[t+j] = (at[j] - at0[j]) / stepsize;
					}
		
					b[i] -= stepsize;
				}
				for(i = 0; i < k;++i) {
					t = i * (N + qd - 1);
					for(j = 0; j < k;++j) {
						t2 = j * (N + qd - 1);
						A[i*k+j] = 0.0;
						for(l = 0; l < N + qd -1;++l) {
							A[i*k+j] += x[t+l] * x[t2+l];
						}

					}
				}

				for(i = 0; i < k;++i) {
					t = i * (N + qd - 1);
					g[i] = 0.0;
					for(l = 0; l < N + qd - 1;++l) {
						g[i] += x[t+l] * at[l];
					}
					D[i] = sqrt(A[i*k+i]);
				}
				
				for(i = 0; i < k;++i) {
					for(j = 0; j < k;++j) {
						A[i*k+j] = A[i*k+j] / (D[i] * D[j]);
						if (i == j) {
							A[i*k+j] = 1.0 + lam;
						}
					}
				}

				for(i = 0; i < k; ++i) {
					g[i] = g[i] / D[i];
				}

	    	}
	    } else {
			lam=lam*vmul;
			vmul=2.0*vmul;
	    }

	}
	
	//printf("Iterations %d \n",it);
	
	if (it >= itmax) {
		retval = 4;
	} else if (it < itmax && it > 0) {
		retval = 1;
	}
	// Residual Variance
	*var = sumb * 1.0 /(N - p - q - M);
	//Constant Term
	if (M == 1) {
		temp = 0.0;
		for (i = 0;i < p;++i) {
			temp += phiinc[i];
		}
		*thetac = b[0] * (1.0 - temp);
	} else {
		*thetac = 0.0;
	}
	// Parameters Phi and Theta
	
	for (i = 0; i < p;++i) {
		phi[i] = phiinc[i];
	}
	for (i = 0; i < q;++i) {
		theta[i] = thetainc[i];
	}

	for(i = 0; i < k;++i) {
		t = i * (N + qd - 1);
		for(j = 0; j < k;++j) {
			t2 = j * (N + qd - 1);
			A[i*k+j] = 0.0;
			for(l = 0; l < N + qd -1;++l) {
				A[i*k+j] += x[t+l] * x[t2+l];
			}

		}
	}

	ludecomp(A,k,ipiv);
	minverse(A,k,ipiv,varcovar);

	//mdisplay(varcovar, 1, k*k);

	for(i = 0; i < k*k;++i) {
		varcovar[i] = varcovar[i] * (*var);
	}

	for(i = qd-1; i < N+qd-1;++i) {
		residuals[i-qd+1] = resat[i];
	}


	free(inp);
	free(orig);
	free(phi0);
	free(theta0);
	free(b);
	free(at);
	free(at0);
	free(x);
	free(A);
	free(g);
	free(D);
	free(h);
	free(binc);
	free(ipiv);
	free(phiinc);
	free(thetainc);
	free(atinc);
	free(resat);
	free(origval);
	free(Atemp);
	return retval;
}